

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O1

void __thiscall icu_63::RBBINode::RBBINode(RBBINode *this,RBBINode *other)

{
  UVector *pUVar1;
  UnicodeString *src;
  UErrorCode status;
  UErrorCode local_1c;
  
  (this->fText).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->fText).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fType = other->fType;
  this->fParent = (RBBINode *)0x0;
  this->fLeftChild = (RBBINode *)0x0;
  this->fRightChild = (RBBINode *)0x0;
  this->fInputSet = other->fInputSet;
  this->fPrecedence = other->fPrecedence;
  src = &other->fText;
  UnicodeString::operator=(&this->fText,src);
  this->fFirstPos = other->fFirstPos;
  this->fLastPos = other->fLastPos;
  this->fNullable = other->fNullable;
  this->fVal = other->fVal;
  this->fRuleRoot = '\0';
  this->fChainIn = other->fChainIn;
  local_1c = U_ZERO_ERROR;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    src = (UnicodeString *)&stack0xffffffffffffffe4;
    UVector::UVector(pUVar1,(UErrorCode *)src);
  }
  this->fFirstPosSet = pUVar1;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    src = (UnicodeString *)&stack0xffffffffffffffe4;
    UVector::UVector(pUVar1,(UErrorCode *)src);
  }
  this->fLastPosSet = pUVar1;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)src);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    UVector::UVector(pUVar1,&stack0xffffffffffffffe4);
  }
  this->fFollowPos = pUVar1;
  return;
}

Assistant:

RBBINode::RBBINode(const RBBINode &other) : UMemory(other) {
#ifdef RBBI_DEBUG
    fSerialNum   = ++gLastSerial;
#endif
    fType        = other.fType;
    fParent      = NULL;
    fLeftChild   = NULL;
    fRightChild  = NULL;
    fInputSet    = other.fInputSet;
    fPrecedence  = other.fPrecedence;
    fText        = other.fText;
    fFirstPos    = other.fFirstPos;
    fLastPos     = other.fLastPos;
    fNullable    = other.fNullable;
    fVal         = other.fVal;
    fRuleRoot    = FALSE;
    fChainIn     = other.fChainIn;
    UErrorCode     status = U_ZERO_ERROR;
    fFirstPosSet = new UVector(status);   // TODO - get a real status from somewhere
    fLastPosSet  = new UVector(status);
    fFollowPos   = new UVector(status);
}